

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,
          shared_ptr<polyscope::render::AttributeBuffer> *externalBuffer)

{
  vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
  *a;
  pointer pGVar1;
  __type _Var2;
  int iVar3;
  invalid_argument *piVar4;
  RenderDataType *r;
  RenderDataType *r_00;
  GLShaderProgram *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  RenderDataType local_d4;
  shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> engineExtBuff;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pGVar1 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (GLShaderProgram *)
            &((this->attributes).
              super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
              ._M_impl.super__Vector_impl_data._M_start)->buff;
  while( true ) {
    a = &this_00[-1].textures;
    if ((pointer)a == pGVar1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_118,"Tried to set nonexistent attribute with name ",name);
      std::invalid_argument::invalid_argument(piVar4,(string *)&bStack_118);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,
                            name);
    if (_Var2) break;
    this_00 = (GLShaderProgram *)&(this_00->super_ShaderProgram).instanceCount;
  }
  iVar3 = renderDataTypeCountCompatbility
                    (*(RenderDataType *)
                      &this_00[-1].compiledProgram.
                       super___shared_ptr<polyscope::render::backend_openGL_mock::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,
                     ((externalBuffer->
                      super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->dataType);
  if (iVar3 == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,"Tried to set attribute ",name);
    std::operator+(&local_50,&local_70," to incompatibile type. Attribute ");
    renderDataTypeName_abi_cxx11_
              (&local_90,
               (polyscope *)
               &this_00[-1].compiledProgram.
                super___shared_ptr<polyscope::render::backend_openGL_mock::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,r);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &engineExtBuff,&local_50,&local_90);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &engineExtBuff," set with buffer of type ");
    local_d4 = ((externalBuffer->
                super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->dataType;
    renderDataTypeName_abi_cxx11_(&local_b0,(polyscope *)&local_d4,r_00);
    std::operator+(&bStack_118,&local_f8,&local_b0);
    std::invalid_argument::invalid_argument(piVar4,(string *)&bStack_118);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((this_00->super_ShaderProgram)._vptr_ShaderProgram != (_func_int **)0x0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_f8,"attribute ",name);
    std::operator+(&bStack_118,&local_f8," is already set");
    std::invalid_argument::invalid_argument(piVar4,(string *)&bStack_118);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL_mock::GLAttributeBuffer,polyscope::render::AttributeBuffer>
            ((shared_ptr<polyscope::render::AttributeBuffer> *)&engineExtBuff);
  if (engineExtBuff.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::
    __shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                 *)this_00,
                &engineExtBuff.
                 super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
               );
    assignBufferToVAO(this_00,(GLShaderAttribute *)a);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&engineExtBuff.
                super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_f8,"attribute ",name);
  std::operator+(&bStack_118,&local_f8," external buffer engine type cast failed");
  std::invalid_argument::invalid_argument(piVar4,(string *)&bStack_118);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, std::shared_ptr<AttributeBuffer> externalBuffer) {
  bindVAO();
  checkGLError();

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {

      // check that types match
      int compatCount = renderDataTypeCountCompatbility(a.type, externalBuffer->getType());
      if (compatCount == 0)
        throw std::invalid_argument("Tried to set attribute " + name + " to incompatibile type. Attribute " +
                                    renderDataTypeName(a.type) + " set with buffer of type " +
                                    renderDataTypeName(externalBuffer->getType()));

      // check multiple-set errors (duplicates in externalBuffers list?)
      if (a.buff) throw std::invalid_argument("attribute " + name + " is already set");

      // cast to the engine type (booooooo)
      std::shared_ptr<GLAttributeBuffer> engineExtBuff = std::dynamic_pointer_cast<GLAttributeBuffer>(externalBuffer);
      if (!engineExtBuff) throw std::invalid_argument("attribute " + name + " external buffer engine type cast failed");

      a.buff = engineExtBuff;

      a.buff->bind();

      assignBufferToVAO(a);
      return;
    }
  }

  throw std::invalid_argument("Tried to set nonexistent attribute with name " + name);
}